

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LNode.h
# Opt level: O3

void __thiscall
LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
LNodeData(LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,LNodeType type,
         basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  (this->super_LNode).type = type;
  (this->super_LNode)._vptr_LNode = (_func_int **)&PTR__LNodeData_00121d80;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->value);
  return;
}

Assistant:

explicit LNode(LNodeType type) {
        this->type = type;
    }